

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O3

void __thiscall
cmOrderDirectoriesConstraint::FindConflicts(cmOrderDirectoriesConstraint *this,uint index)

{
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *this_00;
  iterator __position;
  bool bVar1;
  int iVar2;
  pair<int,_int> in_RAX;
  pointer pbVar3;
  uint uVar4;
  cmOrderDirectories *this_01;
  ulong uVar5;
  ConflictPair p;
  pair<int,_int> local_38;
  
  this_01 = this->OD;
  pbVar3 = (this_01->OriginalDirectories).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this_01->OriginalDirectories).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar3) {
    uVar4 = 1;
    uVar5 = 0;
    local_38 = in_RAX;
    do {
      bVar1 = cmOrderDirectories::IsSameDirectory(this_01,pbVar3 + uVar5,&this->Directory);
      if (!bVar1) {
        iVar2 = (*this->_vptr_cmOrderDirectoriesConstraint[3])(this,pbVar3 + uVar5);
        if ((char)iVar2 != '\0') {
          local_38.second = index;
          local_38.first = this->DirectoryIndex;
          this_00 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                    ((this->OD->ConflictGraph).
                     super__Vector_base<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar5);
          __position._M_current = *(pair<int,_int> **)(this_00 + 8);
          if (__position._M_current == *(pair<int,_int> **)(this_00 + 0x10)) {
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            _M_realloc_insert<std::pair<int,int>const&>(this_00,__position,&local_38);
          }
          else {
            *__position._M_current = local_38;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
          }
        }
      }
      uVar5 = (ulong)uVar4;
      this_01 = this->OD;
      pbVar3 = (this_01->OriginalDirectories).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = uVar4 + 1;
    } while (uVar5 < (ulong)((long)(this_01->OriginalDirectories).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5));
  }
  return;
}

Assistant:

void FindConflicts(unsigned int index)
    {
    for(unsigned int i=0; i < this->OD->OriginalDirectories.size(); ++i)
      {
      // Check if this directory conflicts with the entry.
      std::string const& dir = this->OD->OriginalDirectories[i];
      if (!this->OD->IsSameDirectory(dir, this->Directory) &&
          this->FindConflict(dir))
        {
        // The library will be found in this directory but this is not
        // the directory named for it.  Add an entry to make sure the
        // desired directory comes before this one.
        cmOrderDirectories::ConflictPair p(this->DirectoryIndex, index);
        this->OD->ConflictGraph[i].push_back(p);
        }
      }
    }